

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImDrawCmd * __thiscall
ImVector<ImDrawCmd>::insert(ImVector<ImDrawCmd> *this,ImDrawCmd *it,ImDrawCmd *v)

{
  int *piVar1;
  undefined8 *puVar2;
  ImDrawCmd *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ImTextureID pvVar6;
  undefined8 uVar7;
  ImDrawCallback p_Var8;
  int iVar9;
  ImDrawCmd *__dest;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  
  __dest = this->Data;
  lVar12 = (long)it - (long)__dest;
  iVar9 = this->Size;
  if (iVar9 == this->Capacity) {
    if (iVar9 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar9 / 2 + iVar9;
    }
    iVar13 = iVar9 + 1;
    if (iVar9 + 1 < iVar11) {
      iVar13 = iVar11;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImDrawCmd *)(*GImAllocatorAllocFunc)((long)iVar13 * 0x38,GImAllocatorUserData);
    if (this->Data != (ImDrawCmd *)0x0) {
      memcpy(__dest,this->Data,(long)this->Size * 0x38);
      pIVar3 = this->Data;
      if ((pIVar3 != (ImDrawCmd *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    this->Data = __dest;
    this->Capacity = iVar13;
    iVar9 = this->Size;
  }
  lVar10 = (long)iVar9 + (lVar12 >> 3) * -0x6db6db6db6db6db7;
  if (lVar10 != 0 && (lVar12 >> 3) * 0x6db6db6db6db6db7 <= (long)iVar9) {
    memmove((void *)((long)__dest + lVar12 + 0x38),(void *)((long)__dest + lVar12),lVar10 * 0x38);
    __dest = this->Data;
  }
  *(void **)((long)__dest + lVar12 + 0x30) = v->UserCallbackData;
  uVar4 = *(undefined8 *)&v->ClipRect;
  uVar5 = *(undefined8 *)&(v->ClipRect).z;
  pvVar6 = v->TextureId;
  uVar7 = *(undefined8 *)&v->VtxOffset;
  p_Var8 = v->UserCallback;
  puVar2 = (undefined8 *)((long)__dest + lVar12 + 0x20);
  *puVar2 = *(undefined8 *)&v->ElemCount;
  puVar2[1] = p_Var8;
  puVar2 = (undefined8 *)((long)__dest + lVar12 + 0x10);
  *puVar2 = pvVar6;
  puVar2[1] = uVar7;
  *(undefined8 *)((long)__dest + lVar12) = uVar4;
  ((undefined8 *)((long)__dest + lVar12))[1] = uVar5;
  this->Size = this->Size + 1;
  return (ImDrawCmd *)(lVar12 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }